

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Smf.cpp
# Opt level: O3

Smf * rlib::midi::Smf::fromStream(Smf *__return_storage_ptr__,istream *is)

{
  undefined1 uVar1;
  byte bVar2;
  uchar uVar3;
  byte bVar4;
  array<unsigned_char,_2UL> aVar5;
  void *__tmp;
  long lVar6;
  TrackChunk TVar7;
  long lVar8;
  uint64_t uVar9;
  runtime_error *prVar10;
  undefined8 uVar11;
  uint uVar12;
  undefined1 *puVar13;
  char *pcVar14;
  byte bVar15;
  ulong uVar16;
  undefined1 auVar17 [16];
  HeaderChunk HVar18;
  TrackChunk c;
  uint64_t currentPosition;
  uint8_t n;
  exception_ptr ep;
  Track track;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_c8;
  unsigned_long local_b0;
  shared_ptr<rlib::midi::EventExclusive> local_a8;
  long local_98;
  _Rb_tree<rlib::midi::Smf::Event,_rlib::midi::Smf::Event,_std::_Identity<rlib::midi::Smf::Event>,_rlib::midi::Smf::Event::Less,_std::allocator<rlib::midi::Smf::Event>_>
  local_88;
  Smf *local_58;
  list<rlib::midi::Smf::Track,_std::allocator<rlib::midi::Smf::Track>_> *local_50;
  long local_48;
  ulong local_40;
  ulong local_38;
  
  __return_storage_ptr__->timeBase = 0x1e0;
  local_50 = &__return_storage_ptr__->tracks;
  (__return_storage_ptr__->tracks).
  super__List_base<rlib::midi::Smf::Track,_std::allocator<rlib::midi::Smf::Track>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)local_50;
  (__return_storage_ptr__->tracks).
  super__List_base<rlib::midi::Smf::Track,_std::allocator<rlib::midi::Smf::Track>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)local_50;
  (__return_storage_ptr__->tracks).
  super__List_base<rlib::midi::Smf::Track,_std::allocator<rlib::midi::Smf::Track>_>._M_impl._M_node.
  _M_size = 0;
  HVar18 = Inner::read<rlib::midi::Smf::Inner::HeaderChunk>(is);
  local_88._M_impl._0_8_ = HVar18._0_8_;
  local_88._M_impl.super__Rb_tree_header._M_header._M_color = HVar18._8_4_;
  local_88._M_impl.super__Rb_tree_header._M_header._4_2_ = HVar18.division;
  if (HVar18.MThd._M_elems._M_elems != (_Type)0x6468544d) {
    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar10,"MThd chunk error");
    __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  lVar6 = 4;
  puVar13 = &local_88._M_impl.field_0x7;
  do {
    uVar1 = (&local_88._M_impl.field_0x0)[lVar6];
    (&local_88._M_impl.field_0x0)[lVar6] = *puVar13;
    *puVar13 = uVar1;
    puVar13 = puVar13 + -1;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 6);
  auVar17._6_2_ = local_88._M_impl.super__Rb_tree_header._M_header._6_2_;
  auVar17._0_6_ = HVar18._8_6_;
  auVar17._8_8_ = 0;
  auVar17 = psllw(auVar17,8);
  local_88._M_impl.super__Rb_tree_header._M_header._4_2_ =
       local_88._M_impl.super__Rb_tree_header._M_header._4_2_ << 8 |
       (ushort)local_88._M_impl.super__Rb_tree_header._M_header._4_2_ >> 8;
  __return_storage_ptr__->timeBase =
       (uint)(ushort)local_88._M_impl.super__Rb_tree_header._M_header._4_2_;
  local_98 = 0;
  uVar12 = (auVar17._0_4_ | (uint)(ushort)(HVar18.trackCount >> 8) << 0x10) >> 0x10;
  local_40 = (ulong)uVar12;
  if (uVar12 != 0) {
    uVar16 = 0;
    local_58 = __return_storage_ptr__;
    do {
      TVar7 = Inner::read<rlib::midi::Smf::Inner::TrackChunk>(is);
      local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)TVar7;
      if (TVar7.MTrk._M_elems._M_elems != (_Type)0x6b72544d) {
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar10,"MTrk chunk error.");
        __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      lVar6 = 4;
      puVar13 = (undefined1 *)((long)&local_c8 + 7);
      do {
        uVar1 = *(undefined1 *)((long)&local_c8 + lVar6);
        *(undefined1 *)((long)&local_c8 + lVar6) = *puVar13;
        *puVar13 = uVar1;
        puVar13 = puVar13 + -1;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 6);
      local_88._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_88._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_88._M_impl.super__Rb_tree_header._M_header;
      local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_b0 = 0;
      local_88._M_impl.super__Rb_tree_header._M_header._M_right =
           local_88._M_impl.super__Rb_tree_header._M_header._M_left;
      local_38 = uVar16;
      lVar6 = std::istream::tellg();
      bVar15 = 0;
LAB_001524ab:
      while (lVar8 = std::istream::tellg(), lVar8 - lVar6 < (long)((ulong)TVar7 >> 0x20)) {
        uVar9 = fromStream::anon_class_8_1_3fcf65e8::operator()((anon_class_8_1_3fcf65e8 *)is);
        local_b0 = local_b0 + uVar9;
        bVar2 = Inner::read<unsigned_char_const>(is);
        if (-1 < (char)bVar2) {
          std::istream::seekg((long)is,~_S_beg);
          bVar2 = bVar15;
        }
        bVar15 = bVar2;
        switch(bVar2 - 0x80 >> 4) {
        case 0:
          aVar5 = Inner::read<std::array<unsigned_char,2ul>const>(is);
          local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)operator_new(0x20);
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish)->_M_use_count = 1;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish)->_M_weak_count = 1;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish)->_vptr__Sp_counted_base =
               (_func_int **)&PTR___Sp_counted_ptr_inplace_001798b0;
          *(byte *)((long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 0x10U + 8) = bVar2 & 0xf;
          *(byte *)((long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 0x10U + 9) =
               aVar5._M_elems[0] & 0x7f;
          *(byte *)((long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 0x10U + 10) =
               aVar5._M_elems[1] & 0x7f;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          ((long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish + 0x10))->_vptr__Sp_counted_base =
               (_func_int **)&PTR__Event_00179900;
          local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)((long)local_c8.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish + 0x10);
          std::
          _Rb_tree<rlib::midi::Smf::Event,rlib::midi::Smf::Event,std::_Identity<rlib::midi::Smf::Event>,rlib::midi::Smf::Event::Less,std::allocator<rlib::midi::Smf::Event>>
          ::_M_emplace_equal<unsigned_long&,std::shared_ptr<rlib::midi::EventNoteOff>>
                    ((_Rb_tree<rlib::midi::Smf::Event,rlib::midi::Smf::Event,std::_Identity<rlib::midi::Smf::Event>,rlib::midi::Smf::Event::Less,std::allocator<rlib::midi::Smf::Event>>
                      *)&local_88,&local_b0,(shared_ptr<rlib::midi::EventNoteOff> *)&local_c8);
          break;
        case 1:
          aVar5 = Inner::read<std::array<unsigned_char,2ul>const>(is);
          local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)operator_new(0x20);
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish)->_M_use_count = 1;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish)->_M_weak_count = 1;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish)->_vptr__Sp_counted_base =
               (_func_int **)&PTR___Sp_counted_ptr_inplace_00179928;
          *(byte *)((long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 0x10U + 8) = bVar2 & 0xf;
          *(byte *)((long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 0x10U + 9) =
               aVar5._M_elems[0] & 0x7f;
          *(byte *)((long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 0x10U + 10) =
               aVar5._M_elems[1] & 0x7f;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          ((long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish + 0x10))->_vptr__Sp_counted_base =
               (_func_int **)&PTR__Event_00179978;
          local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)((long)local_c8.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish + 0x10);
          std::
          _Rb_tree<rlib::midi::Smf::Event,rlib::midi::Smf::Event,std::_Identity<rlib::midi::Smf::Event>,rlib::midi::Smf::Event::Less,std::allocator<rlib::midi::Smf::Event>>
          ::_M_emplace_equal<unsigned_long&,std::shared_ptr<rlib::midi::EventNoteOn>>
                    ((_Rb_tree<rlib::midi::Smf::Event,rlib::midi::Smf::Event,std::_Identity<rlib::midi::Smf::Event>,rlib::midi::Smf::Event::Less,std::allocator<rlib::midi::Smf::Event>>
                      *)&local_88,&local_b0,(shared_ptr<rlib::midi::EventNoteOn> *)&local_c8);
          break;
        case 2:
          aVar5 = Inner::read<std::array<unsigned_char,2ul>const>(is);
          local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)operator_new(0x20);
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish)->_M_use_count = 1;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish)->_M_weak_count = 1;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish)->_vptr__Sp_counted_base =
               (_func_int **)&PTR___Sp_counted_ptr_inplace_001799a0;
          *(byte *)((long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 0x10U + 8) = bVar2 & 0xf;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          ((long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish + 0x10))->_vptr__Sp_counted_base =
               (_func_int **)&PTR__Event_001799f0;
          *(byte *)((long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 0x10U + 9) =
               aVar5._M_elems[0] & 0x7f;
          *(byte *)((long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 0x10U + 10) =
               aVar5._M_elems[1] & 0x7f;
          local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)((long)local_c8.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish + 0x10);
          std::
          _Rb_tree<rlib::midi::Smf::Event,rlib::midi::Smf::Event,std::_Identity<rlib::midi::Smf::Event>,rlib::midi::Smf::Event::Less,std::allocator<rlib::midi::Smf::Event>>
          ::_M_emplace_equal<unsigned_long&,std::shared_ptr<rlib::midi::EventPolyphonicKeyPressure>>
                    ((_Rb_tree<rlib::midi::Smf::Event,rlib::midi::Smf::Event,std::_Identity<rlib::midi::Smf::Event>,rlib::midi::Smf::Event::Less,std::allocator<rlib::midi::Smf::Event>>
                      *)&local_88,&local_b0,
                     (shared_ptr<rlib::midi::EventPolyphonicKeyPressure> *)&local_c8);
          break;
        case 3:
          aVar5 = Inner::read<std::array<unsigned_char,2ul>const>(is);
          local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)operator_new(0x28);
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish)->_M_use_count = 1;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish)->_M_weak_count = 1;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish)->_vptr__Sp_counted_base =
               (_func_int **)&PTR___Sp_counted_ptr_inplace_00179a30;
          *(byte *)((long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 0x10U + 8) = bVar2 & 0xf;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          ((long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish + 0x10))->_vptr__Sp_counted_base =
               (_func_int **)&PTR__Event_00179a80;
          *(uint *)((long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 0x10U + 0xc) =
               (ushort)aVar5._M_elems & 0x7f;
          *(byte *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    ((long)local_c8.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish + 0x20))->_vptr__Sp_counted_base =
               aVar5._M_elems[1] & 0x7f;
          local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)((long)local_c8.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish + 0x10);
          std::
          _Rb_tree<rlib::midi::Smf::Event,rlib::midi::Smf::Event,std::_Identity<rlib::midi::Smf::Event>,rlib::midi::Smf::Event::Less,std::allocator<rlib::midi::Smf::Event>>
          ::_M_emplace_equal<unsigned_long&,std::shared_ptr<rlib::midi::EventControlChange>>
                    ((_Rb_tree<rlib::midi::Smf::Event,rlib::midi::Smf::Event,std::_Identity<rlib::midi::Smf::Event>,rlib::midi::Smf::Event::Less,std::allocator<rlib::midi::Smf::Event>>
                      *)&local_88,&local_b0,(shared_ptr<rlib::midi::EventControlChange> *)&local_c8)
          ;
          break;
        case 4:
          bVar4 = Inner::read<unsigned_char_const>(is);
          local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)operator_new(0x20);
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish)->_M_use_count = 1;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish)->_M_weak_count = 1;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish)->_vptr__Sp_counted_base =
               (_func_int **)&PTR___Sp_counted_ptr_inplace_00179aa8;
          *(byte *)((long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 0x10U + 8) = bVar2 & 0xf;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          ((long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish + 0x10))->_vptr__Sp_counted_base =
               (_func_int **)&PTR__Event_00179af8;
          *(byte *)((long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 0x10U + 9) = bVar4 & 0x7f;
          local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)((long)local_c8.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish + 0x10);
          std::
          _Rb_tree<rlib::midi::Smf::Event,rlib::midi::Smf::Event,std::_Identity<rlib::midi::Smf::Event>,rlib::midi::Smf::Event::Less,std::allocator<rlib::midi::Smf::Event>>
          ::_M_emplace_equal<unsigned_long&,std::shared_ptr<rlib::midi::EventProgramChange>>
                    ((_Rb_tree<rlib::midi::Smf::Event,rlib::midi::Smf::Event,std::_Identity<rlib::midi::Smf::Event>,rlib::midi::Smf::Event::Less,std::allocator<rlib::midi::Smf::Event>>
                      *)&local_88,&local_b0,(shared_ptr<rlib::midi::EventProgramChange> *)&local_c8)
          ;
          break;
        case 5:
          bVar4 = Inner::read<unsigned_char_const>(is);
          local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)operator_new(0x20);
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish)->_M_use_count = 1;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish)->_M_weak_count = 1;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish)->_vptr__Sp_counted_base =
               (_func_int **)&PTR___Sp_counted_ptr_inplace_00179b98;
          *(byte *)((long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 0x10U + 8) = bVar2 & 0xf;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          ((long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish + 0x10))->_vptr__Sp_counted_base =
               (_func_int **)&PTR__Event_00179be8;
          *(byte *)((long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 0x10U + 9) = bVar4 & 0x7f;
          local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)((long)local_c8.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish + 0x10);
          std::
          _Rb_tree<rlib::midi::Smf::Event,rlib::midi::Smf::Event,std::_Identity<rlib::midi::Smf::Event>,rlib::midi::Smf::Event::Less,std::allocator<rlib::midi::Smf::Event>>
          ::_M_emplace_equal<unsigned_long&,std::shared_ptr<rlib::midi::EventChannelPressure>>
                    ((_Rb_tree<rlib::midi::Smf::Event,rlib::midi::Smf::Event,std::_Identity<rlib::midi::Smf::Event>,rlib::midi::Smf::Event::Less,std::allocator<rlib::midi::Smf::Event>>
                      *)&local_88,&local_b0,
                     (shared_ptr<rlib::midi::EventChannelPressure> *)&local_c8);
          break;
        case 6:
          aVar5 = Inner::read<std::array<unsigned_char,2ul>const>(is);
          local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)operator_new(0x20);
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish)->_M_use_count = 1;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish)->_M_weak_count = 1;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish)->_vptr__Sp_counted_base =
               (_func_int **)&PTR___Sp_counted_ptr_inplace_00179b20;
          *(byte *)((long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 0x10U + 8) = bVar2 & 0xf;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          ((long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish + 0x10))->_vptr__Sp_counted_base =
               (_func_int **)&PTR__Event_00179b70;
          *(ushort *)
           ((long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish + 0x10U + 10) =
               ((ushort)aVar5._M_elems >> 1 & 0x3f80) + ((ushort)aVar5._M_elems & 0x7f) + -0x2000;
          local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)((long)local_c8.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish + 0x10);
          std::
          _Rb_tree<rlib::midi::Smf::Event,rlib::midi::Smf::Event,std::_Identity<rlib::midi::Smf::Event>,rlib::midi::Smf::Event::Less,std::allocator<rlib::midi::Smf::Event>>
          ::_M_emplace_equal<unsigned_long&,std::shared_ptr<rlib::midi::EventPitchBend>>
                    ((_Rb_tree<rlib::midi::Smf::Event,rlib::midi::Smf::Event,std::_Identity<rlib::midi::Smf::Event>,rlib::midi::Smf::Event::Less,std::allocator<rlib::midi::Smf::Event>>
                      *)&local_88,&local_b0,(shared_ptr<rlib::midi::EventPitchBend> *)&local_c8);
          break;
        default:
          if (bVar2 != 0xff) goto code_r0x001526fb;
          bVar2 = Inner::read<unsigned_char_const>(is);
          uVar9 = fromStream::anon_class_8_1_3fcf65e8::operator()((anon_class_8_1_3fcf65e8 *)is);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    (&local_c8,uVar9,(allocator_type *)&local_a8);
          lVar8 = std::istream::read((char *)is,
                                     (long)local_c8.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start);
          if ((long)*(size_type *)(lVar8 + 8) <
              (long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start) {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      (&local_c8,*(size_type *)(lVar8 + 8));
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::clog,"[warning] meta data size error.",0x1f);
            std::ios::widen((char)*(undefined8 *)(std::clog + -0x18));
            std::ostream::put('\0');
            std::ostream::flush();
          }
          local_a8.super___shared_ptr<rlib::midi::EventExclusive,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
          (local_a8.super___shared_ptr<rlib::midi::EventExclusive,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count = 1;
          (local_a8.super___shared_ptr<rlib::midi::EventExclusive,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_weak_count = 1;
          (local_a8.super___shared_ptr<rlib::midi::EventExclusive,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_vptr__Sp_counted_base =
               (_func_int **)&PTR___Sp_counted_ptr_inplace_00179828;
          local_a8.super___shared_ptr<rlib::midi::EventExclusive,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = (element_type *)
                 (local_a8.
                  super___shared_ptr<rlib::midi::EventExclusive,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi + 1);
          local_a8.super___shared_ptr<rlib::midi::EventExclusive,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi[1]._vptr__Sp_counted_base = (_func_int **)&PTR__EventMeta_00179878;
          local_a8.super___shared_ptr<rlib::midi::EventExclusive,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi[1]._M_use_count = (uint)bVar2;
          local_a8.super___shared_ptr<rlib::midi::EventExclusive,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi[2]._vptr__Sp_counted_base =
               (_func_int **)
               local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
          *(pointer *)
           &local_a8.super___shared_ptr<rlib::midi::EventExclusive,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi[2]._M_use_count =
               local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_a8.super___shared_ptr<rlib::midi::EventExclusive,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi[3]._vptr__Sp_counted_base =
               (_func_int **)
               local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::
          _Rb_tree<rlib::midi::Smf::Event,rlib::midi::Smf::Event,std::_Identity<rlib::midi::Smf::Event>,rlib::midi::Smf::Event::Less,std::allocator<rlib::midi::Smf::Event>>
          ::_M_emplace_equal<unsigned_long&,std::shared_ptr<rlib::midi::EventMeta>>
                    ((_Rb_tree<rlib::midi::Smf::Event,rlib::midi::Smf::Event,std::_Identity<rlib::midi::Smf::Event>,rlib::midi::Smf::Event::Less,std::allocator<rlib::midi::Smf::Event>>
                      *)&local_88,&local_b0,(shared_ptr<rlib::midi::EventMeta> *)&local_a8);
          goto LAB_00152ae7;
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0
           ) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
        }
      }
      std::__cxx11::list<rlib::midi::Smf::Track,_std::allocator<rlib::midi::Smf::Track>_>::
      _M_insert<rlib::midi::Smf::Track>(local_50,(iterator)local_50,(Track *)&local_88);
      uVar16 = local_38;
      std::
      _Rb_tree<rlib::midi::Smf::Event,_rlib::midi::Smf::Event,_std::_Identity<rlib::midi::Smf::Event>,_rlib::midi::Smf::Event::Less,_std::allocator<rlib::midi::Smf::Event>_>
      ::~_Rb_tree(&local_88);
      uVar16 = uVar16 + 1;
    } while (uVar16 != local_40);
    __return_storage_ptr__ = local_58;
    if (local_98 != 0) {
      local_48 = local_98;
      std::__exception_ptr::exception_ptr::_M_addref();
      uVar11 = std::rethrow_exception((exception_ptr)&local_48);
      __cxa_free_exception(uVar16);
      std::__cxx11::_List_base<rlib::midi::Smf::Track,_std::allocator<rlib::midi::Smf::Track>_>::
      _M_clear(&local_50->
                super__List_base<rlib::midi::Smf::Track,_std::allocator<rlib::midi::Smf::Track>_>);
      _Unwind_Resume(uVar11);
    }
  }
  return __return_storage_ptr__;
code_r0x001526fb:
  if (bVar2 == 0xf0) {
    uVar9 = fromStream::anon_class_8_1_3fcf65e8::operator()((anon_class_8_1_3fcf65e8 *)is);
    local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (uchar *)0x0;
    for (; uVar9 != 0; uVar9 = uVar9 - 1) {
      uVar3 = Inner::read<unsigned_char_const>(is);
      local_a8.super___shared_ptr<rlib::midi::EventExclusive,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           CONCAT71(local_a8.
                    super___shared_ptr<rlib::midi::EventExclusive,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr._1_7_,uVar3);
      if (uVar3 == 0xf7) {
        lVar8 = 0x3d;
        pcVar14 = "[warning] exclusive size error. EOX(0xf7) is failed position.";
        if (uVar9 != 1) {
LAB_00152a32:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,pcVar14,lVar8);
          std::ios::widen((char)*(undefined8 *)(std::clog + -0x18));
          std::ostream::put('\0');
          std::ostream::flush();
        }
        break;
      }
      if ((char)uVar3 < '\0') {
        lVar8 = 0x35;
        pcVar14 = "[warning] exclusive data error. EOX(0xf7) is missing.";
        goto LAB_00152a32;
      }
      if (local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_realloc_insert<unsigned_char_const&>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_c8,
                   (iterator)
                   local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(uchar *)&local_a8);
      }
      else {
        *local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish = uVar3;
        local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)(local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish + 1);
      }
    }
    local_a8.super___shared_ptr<rlib::midi::EventExclusive,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
    (local_a8.super___shared_ptr<rlib::midi::EventExclusive,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi)->_M_use_count = 1;
    (local_a8.super___shared_ptr<rlib::midi::EventExclusive,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi)->_M_weak_count = 1;
    (local_a8.super___shared_ptr<rlib::midi::EventExclusive,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00179c28;
    local_a8.super___shared_ptr<rlib::midi::EventExclusive,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         (local_a8.super___shared_ptr<rlib::midi::EventExclusive,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi + 1);
    local_a8.super___shared_ptr<rlib::midi::EventExclusive,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi[1]._vptr__Sp_counted_base = (_func_int **)&PTR__EventExclusive_00179c78;
    *(pointer *)
     &local_a8.super___shared_ptr<rlib::midi::EventExclusive,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi[1]._M_use_count =
         local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_a8.super___shared_ptr<rlib::midi::EventExclusive,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi[2]._vptr__Sp_counted_base =
         (_func_int **)
         local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    *(pointer *)
     &local_a8.super___shared_ptr<rlib::midi::EventExclusive,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi[2]._M_use_count =
         local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    _Rb_tree<rlib::midi::Smf::Event,rlib::midi::Smf::Event,std::_Identity<rlib::midi::Smf::Event>,rlib::midi::Smf::Event::Less,std::allocator<rlib::midi::Smf::Event>>
    ::_M_emplace_equal<unsigned_long&,std::shared_ptr<rlib::midi::EventExclusive>>
              ((_Rb_tree<rlib::midi::Smf::Event,rlib::midi::Smf::Event,std::_Identity<rlib::midi::Smf::Event>,rlib::midi::Smf::Event::Less,std::allocator<rlib::midi::Smf::Event>>
                *)&local_88,&local_b0,&local_a8);
LAB_00152ae7:
    if (local_a8.super___shared_ptr<rlib::midi::EventExclusive,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_a8.super___shared_ptr<rlib::midi::EventExclusive,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if ((element_type *)
        local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (element_type *)0x0) {
      operator_delete(local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_c8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_c8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  goto LAB_001524ab;
}

Assistant:

Smf Smf::fromStream(std::istream& is)
{
	using namespace midi;

	Smf smf;

	const auto headerChunk = [&is]() {
		Inner::HeaderChunk c = Inner::read<decltype(c)>(is);
		if (c.MThd != Inner::HeaderChunk().MThd) {
			throw std::runtime_error("MThd chunk error");
		}
		Inner::changeEndian(c.dataLength);
		Inner::changeEndian(c.format);
		Inner::changeEndian(c.trackCount);
		Inner::changeEndian(c.division);
		return c;
	}();

	smf.timeBase = headerChunk.division;

	// トラックチャンク
	std::exception_ptr ep;	// 例外保持
	try {
		for (size_t i = 0; i < headerChunk.trackCount; i++) {
			const auto trackChunk = [&is]() {
				Inner::TrackChunk c = Inner::read<decltype(c)>(is);
				if (c.MTrk != Inner::TrackChunk().MTrk) {
					throw std::runtime_error("MTrk chunk error.");
				}
				Inner::changeEndian(c.dataLength);
				return c;
			}();

			Smf::Track track;
			try{
				std::uint64_t currentPosition = 0;		// 現在位置
				uint8_t beforeStatus = 0;
				for (const auto beginPosition = is.tellg(); is.tellg() - beginPosition < trackChunk.dataLength; ) {
					auto readVariableValue = [&is] {					// 可変長数値を取得
						return inner::readVariableValue([&] {return Inner::read<uint8_t>(is); });
					};

					currentPosition += readVariableValue();		// 現在位置 += デルタタイム

					// status 読み込み
					const auto status = [&] {
						const uint8_t status = Inner::read<decltype(status)>(is);
						if (!(status & 0x80)) {					// status 省略なら直前値を採用
							is.seekg(-1, std::ios::cur);		// 位置を戻す
							return beforeStatus;
						}
						beforeStatus = status;
						return status;
					}();

					switch (status & 0xf0) {
					case EventNoteOff::statusByte: {
						const std::array<uint8_t, 2> a = Inner::read<decltype(a)>(is);
						track.events.emplace(currentPosition, std::make_shared<EventNoteOff>(status & 0xf, a[0] & 0x7f, a[1] & 0x7f));
						break;
					}
					case EventNoteOn::statusByte: {
						const std::array<uint8_t, 2> a = Inner::read<decltype(a)>(is);
						track.events.emplace(currentPosition, std::make_shared<EventNoteOn>(status & 0xf, a[0] & 0x7f, a[1] & 0x7f));
						break;
					}
					case EventPolyphonicKeyPressure::statusByte: {
						const std::array<uint8_t, 2> a = Inner::read<decltype(a)>(is);
						track.events.emplace(currentPosition, std::make_shared<EventPolyphonicKeyPressure>(status & 0xf, a[0] & 0x7f, a[1] & 0x7f));
						break;
					}
					case EventControlChange::statusByte: {
						const std::array<uint8_t, 2> a = Inner::read<decltype(a)>(is);
						track.events.emplace(currentPosition, std::make_shared<EventControlChange>(status & 0xf, a[0] & 0x7f, a[1] & 0x7f));
						break;
					}
					case EventProgramChange::statusByte: {
						const uint8_t n = Inner::read<decltype(n)>(is);
						track.events.emplace(currentPosition, std::make_shared<EventProgramChange>(status & 0xf, n & 0x7f));
						break;
					}
					case EventPitchBend::statusByte: {
						const std::array<uint8_t, 2> a = Inner::read<decltype(a)>(is);
						const auto n = ((a[0] & 0x7f) + (a[1] & 0x7f) * 0x80) - 8192;
						track.events.emplace(currentPosition, std::make_shared<EventPitchBend>(status & 0xf, n));
						break;
					}
					case EventChannelPressure::statusByte: {
						const uint8_t n = Inner::read<decltype(n)>(is);
						track.events.emplace(currentPosition, std::make_shared<EventChannelPressure>(status & 0xf, n & 0x7f));
						break;
					}
					default:
						switch (status) {
						case EventExclusive::statusByte: {
							const auto size = readVariableValue();		// データ長
							std::vector<uint8_t> data;
							for (auto i = 0; i < size; i++) {
								const uint8_t n = Inner::read<decltype(n)>(is);
								if (n == 0xf7) {				// EOX(終了コード)
									if (i != size - 1) {
										// ヘンなところで終わった(が、エラーにはせず続行)
										std::clog << "[warning] exclusive size error. EOX(0xf7) is failed position." << std::endl;	// throw std::runtime_error("exclusive size error");
										break;
									}
									break;
								}
								if ((n & 0x80) != 0) {
									// あるべきハズのEOX(0xf7)が無い(が、エラーにはせず続行)
									std::clog << "[warning] exclusive data error. EOX(0xf7) is missing." << std::endl;
									break;
								}
								data.push_back(n);
							}
							track.events.emplace(currentPosition, std::make_shared<EventExclusive>(std::move(data)));
							break;
						}
						case EventMeta::statusByte: {
							const uint8_t type = Inner::read<decltype(type)>(is);					// イベントタイプ
							const auto len = readVariableValue();									// データ長
							std::vector<uint8_t> data(len);
							if (const auto readed = is.read(reinterpret_cast<char*>(data.data()), data.size()).gcount(); readed < static_cast<std::intmax_t>(data.size())) {
								data.resize(readed);
								// データが足りない(が、エラーにはせず続行)
								std::clog << "[warning] meta data size error." << std::endl;
							}
							track.events.emplace(currentPosition, std::make_shared<EventMeta>(static_cast<EventMeta::Type>(type), std::move(data)));
							break;
						}
						default:
							assert(false);
							break;
						}
					}
				}
			} catch (...) {
				if (track.events.size() > 0) {
					smf.tracks.emplace_back(std::move(track));
				}
				throw;
			}
			smf.tracks.emplace_back(std::move(track));
		}
	} catch (...) {
		ep = std::current_exception();
	}
	if (ep) {
		try {
			std::rethrow_exception(ep);
		} catch (const std::exception& e) {
			std::clog << "[warning] exception: " << e.what() << std::endl;
		} catch (...) {
			std::clog << "[warning] exception unknwon" << std::endl;
		}
		if (smf.tracks.size() <= 0) {	// トラックがまったくパースできてない状態なら
			std::rethrow_exception(ep);	// throw で終了
		}
	}
	return smf;
}